

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbift3.cpp
# Opt level: O2

void CVmBifT3::get_named_arg_list(uint argc)

{
  long lVar1;
  ushort uVar2;
  vm_val_t *pvVar3;
  vm_obj_id_t vVar4;
  ushort *puVar5;
  uint uVar6;
  size_t idx;
  uint16_t tmp;
  int iVar7;
  int iVar8;
  CVmObjPageEntry *this;
  vm_val_t **ppvVar9;
  vm_val_t *argp;
  vm_val_t str;
  
  iVar7 = 0;
  CVmBif::check_argc(argc,0);
  pvVar3 = sp_;
  sp_ = sp_ + 1;
  vVar4 = CVmObjList::create(0,10);
  pvVar3->typ = VM_OBJ;
  (pvVar3->val).obj = vVar4;
  this = G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc] + (sp_[-1].val.obj & 0xfff);
  CVmObjList::cons_clear((CVmObjList *)this);
  ppvVar9 = &frame_ptr_;
  while (pvVar3 = *ppvVar9, pvVar3 != (vm_val_t *)0x0) {
    puVar5 = (ushort *)CVmRun::get_named_args_from_frame(pvVar3,&argp);
    if (puVar5 != (ushort *)0x0) {
      lVar1 = (ulong)*puVar5 - 1;
      uVar6 = (int)lVar1 * 2;
      argp = argp + lVar1;
      iVar8 = iVar7 + (uint)*puVar5;
      for (idx = (size_t)iVar7; iVar7 = iVar8, (long)iVar8 != idx; idx = idx + 1) {
        uVar2 = *(ushort *)((long)puVar5 + (ulong)uVar6 + 2);
        str.val.obj = CVmObjString::create
                                (0,(char *)((long)puVar5 + (ulong)uVar2 + 2),
                                 (ulong)((uint)*(ushort *)((long)puVar5 + (ulong)uVar6 + 4) -
                                        (uint)uVar2));
        str.typ = VM_OBJ;
        CVmObjList::cons_ensure_space((CVmObjList *)this,idx,10);
        CVmObjList::cons_set_element((CVmObjList *)this,idx,&str);
        uVar6 = uVar6 - 2;
        argp = argp + -1;
      }
    }
    ppvVar9 = (vm_val_t **)&pvVar3[-1].val;
  }
  **(undefined2 **)((long)&this->ptr_ + 8) = (short)iVar7;
  CVmObjList::cons_uniquify((CVmObjList *)this);
  CVmBif::retval_pop();
  return;
}

Assistant:

void CVmBifT3::get_named_arg_list(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 0);
    
    /* create the result list; we'll expand as necessary later */
    G_stk->push()->set_obj(CVmObjList::create(vmg_ FALSE, 10));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ G_stk->get(0)->val.obj);

    /* clear it out, since we're building it incrementally */
    lst->cons_clear();

    /* we haven't added any elements yet */
    int idx = 0;

    /* scan the stack and populate the name list from the tables we find */
    for (vm_val_t *fp = G_interpreter->get_frame_ptr() ; fp != 0 ;
         fp = G_interpreter->get_enclosing_frame_ptr(vmg_ fp))
    {
        /* look for a named argument table in this frame */
        vm_val_t *argp;
        const uchar *t = CVmRun::get_named_args_from_frame(vmg_ fp, &argp);
        if (t != 0)
        {
            /* get the number of table entries */
            int n = osrp2(t);
            t += 2;

            /* 
             *   Build the list.  The compiler generates the list in
             *   right-to-left order (the order of pushing the arguments).
             *   For readability, reverse this: generate the list left to
             *   right, so that it appears in the original source code order.
             */
            argp += n - 1;
            for (int i = (n-1)*2 ; i >= 0 ; i -= 2, --argp)
            {
                /* get this string's offset and figure its length */
                uint ofs = osrp2(t + i);
                uint len = osrp2(t + i + 2) - ofs;
                
                /* create a string from the name */
                vm_val_t str;
                str.set_obj(CVmObjString::create(
                    vmg_ FALSE, (const char *)t + ofs, len));

                /* add it to the list */
                lst->cons_ensure_space(vmg_ idx, 10);
                lst->cons_set_element(idx, &str);
                ++idx;
            }
        }
    }

    /* set the final list length */
    lst->cons_set_len(idx);

    /* keep only the unique elements */
    lst->cons_uniquify(vmg0_);

    /* return the results */
    retval_pop(vmg0_);
}